

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O2

void __thiscall
sjtu::UserManager::add_order(UserManager *this,OrderManager *order_manager,orderType *order)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  locType extraout_RDX;
  pair<long,_bool> pVar3;
  allocator local_71;
  OrderManager *local_70;
  hashType local_68;
  string local_60;
  long local_40;
  undefined1 local_38;
  void *__dest;
  undefined4 extraout_var_00;
  
  local_70 = order_manager;
  iVar1 = (*(order_manager->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
            _vptr_FileManager_Base[1])();
  __dest = (void *)CONCAT44(extraout_var,iVar1);
  memcpy(__dest,order,0xb0);
  order->offset = extraout_RDX;
  *(locType *)((long)__dest + 0xb0) = extraout_RDX;
  this_00 = this->UserBpTree;
  std::__cxx11::string::string((string *)&local_60,order->username,&local_71);
  local_68 = StringHasher::operator()((StringHasher *)this,&local_60);
  pVar3 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_68);
  local_40 = pVar3.first;
  local_38 = pVar3.second;
  std::__cxx11::string::~string((string *)&local_60);
  iVar1 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                    (this->UserFile,&local_40);
  lVar2 = CONCAT44(extraout_var_00,iVar1);
  *(undefined8 *)((long)__dest + 0xb8) = *(undefined8 *)(lVar2 + 0x70);
  *(locType *)(lVar2 + 0x70) = extraout_RDX;
  *(int *)(lVar2 + 0x80) = *(int *)(lVar2 + 0x80) + 1;
  (*(local_70->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
    _vptr_FileManager_Base[3])(local_70->OrderFile,(long)__dest + 0xb0);
  (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
            (this->UserFile,lVar2 + 0x78);
  return;
}

Assistant:

void UserManager::add_order(OrderManager *order_manager, orderType *order) {
            auto ret = order_manager->OrderFile->newspace();          //std::pair<std::pair<orderType , locType>* , locType>
            ret.first -> first = *order;
            ret.first->first.offset = order -> offset = ret.second;
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(order->username));
            userType *cur = UserFile->read(tmp.first);
            ret.first -> second = cur->head;
            cur->head = ret.second;
            ++cur->order_count;
            order_manager->OrderFile->save(ret.first->first.offset);
            UserFile->save(cur->offset);
        }